

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_cube(MTBDD variables,uint8_t *cube,MTBDD terminal)

{
  long *plVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  uint uVar5;
  MTBDD MVar6;
  MTBDD MVar7;
  uint8_t *cube_00;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  
  cube_00 = cube + 1;
  while( true ) {
    if (variables == 0x8000000000000000) {
      return terminal;
    }
    puVar3 = nodes->data;
    lVar9 = (variables & 0xffffffffff) * 0x10;
    uVar2 = cube_00[-1];
    if (uVar2 != '\x02') break;
    variables = variables & 0x8000000000000000 ^ *(ulong *)(puVar3 + lVar9) & 0x800000ffffffffff;
    cube_00 = cube_00 + 1;
  }
  if (uVar2 != '\x03') {
    if (uVar2 == '\x01') {
      MVar7 = mtbdd_cube(variables & 0x8000000000000000 ^
                         *(ulong *)(puVar3 + lVar9) & 0x800000ffffffffff,cube_00,terminal);
      if (MVar7 != 0) {
        uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar9 + 8) >> 0x20);
        MVar6 = 0;
        goto LAB_00106821;
      }
    }
    else if (uVar2 == '\0') {
      MVar6 = mtbdd_cube(variables & 0x8000000000000000 ^
                         *(ulong *)(puVar3 + lVar9) & 0x800000ffffffffff,cube_00,terminal);
      if (MVar6 == 0) {
        return 0;
      }
      uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar9 + 8) >> 0x20);
      MVar7 = 0;
      goto LAB_00106821;
    }
    return 0;
  }
  lVar8 = (*(ulong *)(puVar3 + lVar9) & 0xffffffffff) * 0x10;
  uVar4 = *(undefined8 *)(puVar3 + lVar8 + 8);
  MVar7 = mtbdd_cube((variables ^ *(ulong *)(puVar3 + lVar9)) & 0x8000000000000000 ^
                     *(ulong *)(puVar3 + lVar8) & 0x800000ffffffffff,cube_00 + 1,terminal);
  uVar5 = (uint)((ulong)uVar4 >> 0x20);
  MVar6 = MVar7;
  if (MVar7 != 0) {
    MVar6 = _mtbdd_makenode(uVar5 >> 8,MVar7,0);
  }
  mtbdd_refs_push(MVar6);
  if (MVar7 == 0) {
    MVar7 = 0;
  }
  else {
    MVar7 = _mtbdd_makenode(uVar5 >> 8,0,MVar7);
  }
  plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28);
  *plVar1 = *plVar1 + -8;
  if (MVar6 == MVar7) {
    return MVar6;
  }
  uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + lVar9 + 8) >> 0x20);
LAB_00106821:
  MVar6 = _mtbdd_makenode(uVar5 >> 8,MVar6,MVar7);
  return MVar6;
}

Assistant:

MTBDD
mtbdd_cube(MTBDD variables, uint8_t *cube, MTBDD terminal)
{
    if (variables == mtbdd_true) return terminal;
    mtbddnode_t n = MTBDD_GETNODE(variables);

    BDD result;
    switch (*cube) {
    case 0:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), result, mtbdd_false);
        return result;
    case 1:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), mtbdd_false, result);
        return result;
    case 2:
        return mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
    case 3:
    {
        MTBDD variables2 = node_gethigh(variables, n);
        mtbddnode_t n2 = MTBDD_GETNODE(variables2);
        uint32_t var2 = mtbddnode_getvariable(n2);
        result = mtbdd_cube(node_gethigh(variables2, n2), cube+2, terminal);
        BDD low = mtbdd_makenode(var2, result, mtbdd_false);
        mtbdd_refs_push(low);
        BDD high = mtbdd_makenode(var2, mtbdd_false, result);
        mtbdd_refs_pop(1);
        result = mtbdd_makenode(mtbddnode_getvariable(n), low, high);
        return result;
    }
    default:
        return mtbdd_false; // ?
    }
}